

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O1

void __thiscall CRegister::RegisterGotCount(CRegister *this,CNetChunk *pChunk)

{
  ushort uVar1;
  int iVar2;
  NETADDR *a;
  long lVar3;
  
  uVar1 = *(ushort *)((long)pChunk->m_pData + 8);
  a = &this->m_aMasterserverInfo[0].m_Addr;
  lVar3 = 4;
  do {
    iVar2 = net_addr_comp(a,&pChunk->m_Address,1);
    if (iVar2 == 0) {
      a[1].type = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
      return;
    }
    a = (NETADDR *)(a[1].ip + 0xc);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return;
}

Assistant:

void CRegister::RegisterGotCount(CNetChunk *pChunk)
{
	unsigned char *pData = (unsigned char *)pChunk->m_pData;
	int Count = (pData[sizeof(SERVERBROWSE_COUNT)]<<8) | pData[sizeof(SERVERBROWSE_COUNT)+1];

	for(int i = 0; i < IMasterServer::MAX_MASTERSERVERS; i++)
	{
		if(net_addr_comp(&m_aMasterserverInfo[i].m_Addr, &pChunk->m_Address, true) == 0)
		{
			m_aMasterserverInfo[i].m_Count = Count;
			break;
		}
	}
}